

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjbench.c
# Opt level: O2

int decomp(uchar *srcBuf,uchar **jpegBuf,unsigned_long *jpegSize,uchar *dstBuf,int w,int h,
          int subsamp,int jpegQual,char *fileName,int tilew,int tileh)

{
  int height;
  uint uVar1;
  int iVar2;
  uchar uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  tjhandle handle;
  char *pcVar13;
  long lVar14;
  unsigned_long __size;
  uchar *puVar15;
  int *piVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  char *pcVar20;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int len;
  undefined8 uVar21;
  long lVar22;
  char *pcVar23;
  ulong uVar24;
  uchar *puVar25;
  uchar *puVar26;
  uchar uVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  int local_514;
  uchar *local_510;
  double local_4f8;
  double local_4e8;
  uchar *local_4b8;
  char sizeStr [24];
  char qualStr [13];
  char tempStr [1024];
  undefined1 auStack_38 [8];
  
  sizeStr[0x10] = '\0';
  sizeStr[0x11] = '\0';
  sizeStr[0x12] = '\0';
  sizeStr[0x13] = '\0';
  sizeStr[0x14] = '\0';
  sizeStr[0x15] = '\0';
  sizeStr[0x16] = '\0';
  sizeStr[0x17] = '\0';
  sizeStr[0] = '\0';
  sizeStr[1] = '\0';
  sizeStr[2] = '\0';
  sizeStr[3] = '\0';
  sizeStr[4] = '\0';
  sizeStr[5] = '\0';
  sizeStr[6] = '\0';
  sizeStr[7] = '\0';
  sizeStr[8] = '\0';
  sizeStr[9] = '\0';
  sizeStr[10] = '\0';
  sizeStr[0xb] = '\0';
  sizeStr[0xc] = '\0';
  sizeStr[0xd] = '\0';
  sizeStr[0xe] = '\0';
  sizeStr[0xf] = '\0';
  qualStr[8] = '\0';
  qualStr[9] = '\0';
  qualStr[10] = '\0';
  qualStr[0xb] = '\0';
  qualStr[0xc] = '\0';
  qualStr[0] = '\0';
  qualStr[1] = '\0';
  qualStr[2] = '\0';
  qualStr[3] = '\0';
  qualStr[4] = '\0';
  qualStr[5] = '\0';
  qualStr[6] = '\0';
  qualStr[7] = '\0';
  iVar12 = tjPixelSize[pf];
  iVar5 = (sf.num * w + sf.denom + -1) / sf.denom;
  iVar6 = (sf.denom + sf.num * h + -1) / sf.denom;
  uVar17 = (long)(w + tilew + -1) / (long)tilew;
  uVar24 = uVar17 & 0xffffffff;
  iVar7 = (h + tileh + -1) / tileh;
  if (0 < jpegQual) {
    snprintf(qualStr,0xd,"_Q%d");
  }
  qualStr[0xc] = '\0';
  handle = tjInitDecompress();
  if (handle == (tjhandle)0x0) {
    iVar8 = tjGetErrorCode((tjhandle)0x0);
    pcVar13 = tjGetErrorStr2((tjhandle)0x0);
    if ((flags & 0x2000U) != 0 || iVar8 != 0) {
      pcVar23 = "ERROR";
      if (iVar8 == 0) {
        pcVar23 = "WARNING";
      }
      local_510 = (uchar *)0x0;
      printf("%s in line %d while %s:\n%s\n",pcVar23,0xa2,"executing tjInitDecompress()",pcVar13);
      iVar7 = -1;
      goto LAB_0010b76f;
    }
    iVar8 = strncmp(tjErrorStr,pcVar13,200);
    if ((((iVar8 != 0) || (iVar8 = bcmp(tjErrorMsg,"executing tjInitDecompress()",0x1d), iVar8 != 0)
         ) || (tjErrorCode != 0)) || (tjErrorLine != 0xa2)) {
      strncpy(tjErrorStr,pcVar13,199);
      strncpy(tjErrorMsg,"executing tjInitDecompress()",199);
      tjErrorCode = 0;
      tjErrorLine = 0xa2;
      printf("WARNING in line %d while %s:\n%s\n",0xa2,"executing tjInitDecompress()",pcVar13);
    }
  }
  iVar8 = iVar5 * iVar12;
  lVar14 = (long)iVar8;
  bVar4 = false;
  if (dstBuf == (uchar *)0x0) {
    dstBuf = (uchar *)malloc(iVar6 * lVar14);
    if (dstBuf != (uchar *)0x0) {
      bVar4 = true;
      goto LAB_0010ad91;
    }
    piVar16 = __errno_location();
    pcVar13 = strerror(*piVar16);
    local_510 = (uchar *)0x0;
    printf("ERROR in line %d while %s:\n%s\n",0xa9,"allocating destination buffer",pcVar13);
    bVar4 = false;
    dstBuf = (uchar *)0x0;
LAB_0010b750:
    iVar7 = -1;
    if (handle != (tjhandle)0x0) {
      tjDestroy(handle);
    }
  }
  else {
LAB_0010ad91:
    memset(dstBuf,0x7f,iVar6 * lVar14);
    if (doYUV != 0) {
      iVar9 = tileh;
      iVar18 = tilew;
      if (doTile == 0) {
        iVar9 = iVar6;
        iVar18 = iVar5;
      }
      __size = tjBufSizeYUV2(iVar18,yuvPad,iVar9,subsamp);
      if (__size != 0xffffffffffffffff) {
LAB_0010aeaf:
        local_510 = (uchar *)malloc(__size);
        if (local_510 == (uchar *)0x0) {
          piVar16 = __errno_location();
          pcVar13 = strerror(*piVar16);
          local_510 = (uchar *)0x0;
          printf("ERROR in line %d while %s:\n%s\n",0xb8,"allocating YUV buffer",pcVar13);
          goto LAB_0010b750;
        }
        memset(local_510,0x7f,__size);
        goto LAB_0010aedd;
      }
      iVar9 = tjGetErrorCode(handle);
      pcVar13 = tjGetErrorStr2(handle);
      if ((flags & 0x2000U) == 0 && iVar9 == 0) {
        iVar9 = strncmp(tjErrorStr,pcVar13,200);
        if (((iVar9 != 0) || (iVar9 = bcmp(tjErrorMsg,"allocating YUV buffer",0x16), iVar9 != 0)) ||
           ((tjErrorCode != 0 || (tjErrorLine != 0xb6)))) {
          strncpy(tjErrorStr,pcVar13,199);
          strncpy(tjErrorMsg,"allocating YUV buffer",199);
          tjErrorCode = 0;
          tjErrorLine = 0xb6;
          printf("WARNING in line %d while %s:\n%s\n",0xb6,"allocating YUV buffer",pcVar13);
        }
        goto LAB_0010aeaf;
      }
      pcVar23 = "ERROR";
      if (iVar9 == 0) {
        pcVar23 = "WARNING";
      }
      pcVar20 = "allocating YUV buffer";
      local_510 = (uchar *)0x0;
      uVar21 = 0xb6;
LAB_0010b73f:
      printf("%s in line %d while %s:\n%s\n",pcVar23,uVar21,pcVar20,pcVar13);
      goto LAB_0010b750;
    }
    local_510 = (uchar *)0x0;
LAB_0010aedd:
    local_514 = -1;
    if ((int)uVar17 < 1) {
      uVar24 = 0;
    }
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    local_4f8 = 0.0;
    local_4e8 = 0.0;
    do {
      while( true ) {
        lVar22 = 0;
        dVar28 = getTime();
        local_4b8 = dstBuf;
        for (iVar9 = 0; iVar9 != iVar7; iVar9 = iVar9 + 1) {
          iVar18 = h - iVar9 * tileh;
          if (tileh <= iVar18) {
            iVar18 = tileh;
          }
          lVar22 = (long)(int)lVar22;
          puVar15 = local_4b8;
          uVar17 = uVar24;
          iVar2 = w;
          while (iVar11 = (int)uVar17, uVar17 = (ulong)(iVar11 - 1), iVar11 != 0) {
            iVar11 = iVar2;
            if (tilew <= iVar2) {
              iVar11 = tilew;
            }
            height = iVar18;
            if (doTile == 0) {
              height = iVar6;
              iVar11 = iVar5;
            }
            if (doYUV == 0) {
              iVar11 = tjDecompress2(handle,jpegBuf[lVar22],jpegSize[lVar22],puVar15,iVar11,iVar8,
                                     height,pf,flags);
              if (iVar11 == -1) {
                iVar11 = tjGetErrorCode(handle);
                pcVar13 = tjGetErrorStr2(handle);
                if ((flags & 0x2000U) != 0 || iVar11 != 0) {
                  pcVar23 = "ERROR";
                  if (iVar11 == 0) {
                    pcVar23 = "WARNING";
                  }
                  pcVar20 = "executing tjDecompress2()";
                  uVar21 = 0xd8;
                  goto LAB_0010b73f;
                }
                iVar11 = strncmp(tjErrorStr,pcVar13,200);
                if (((iVar11 != 0) ||
                    (iVar11 = bcmp(tjErrorMsg,"executing tjDecompress2()",0x1a), iVar11 != 0)) ||
                   ((tjErrorCode != 0 || (tjErrorLine != 0xd8)))) {
                  strncpy(tjErrorStr,pcVar13,199);
                  strncpy(tjErrorMsg,"executing tjDecompress2()",199);
                  tjErrorCode = 0;
                  tjErrorLine = 0xd8;
                  printf("WARNING in line %d while %s:\n%s\n",0xd8,"executing tjDecompress2()",
                         pcVar13);
                }
              }
            }
            else {
              iVar10 = tjDecompressToYUV2(handle,jpegBuf[lVar22],jpegSize[lVar22],local_510,iVar11,
                                          yuvPad,height,flags);
              if (iVar10 == -1) {
                iVar10 = tjGetErrorCode(handle);
                pcVar13 = tjGetErrorStr2(handle);
                if ((flags & 0x2000U) != 0 || iVar10 != 0) {
                  pcVar23 = "ERROR";
                  if (iVar10 == 0) {
                    pcVar23 = "WARNING";
                  }
                  pcVar20 = "executing tjDecompressToYUV2()";
                  uVar21 = 0xcf;
                  goto LAB_0010b73f;
                }
                iVar10 = strncmp(tjErrorStr,pcVar13,200);
                if ((((iVar10 != 0) ||
                     (iVar10 = bcmp(tjErrorMsg,"executing tjDecompressToYUV2()",0x1f), iVar10 != 0))
                    || (tjErrorCode != 0)) || (tjErrorLine != 0xcf)) {
                  strncpy(tjErrorStr,pcVar13,199);
                  strncpy(tjErrorMsg,"executing tjDecompressToYUV2()",199);
                  tjErrorCode = 0;
                  tjErrorLine = 0xcf;
                  printf("WARNING in line %d while %s:\n%s\n",0xcf,"executing tjDecompressToYUV2()",
                         pcVar13);
                }
              }
              dVar29 = getTime();
              iVar11 = tjDecodeYUV(handle,local_510,yuvPad,subsamp,puVar15,iVar11,iVar8,height,pf,
                                   flags);
              if (iVar11 == -1) {
                iVar11 = tjGetErrorCode(handle);
                pcVar13 = tjGetErrorStr2(handle);
                if ((flags & 0x2000U) != 0 || iVar11 != 0) {
                  pcVar23 = "ERROR";
                  if (iVar11 == 0) {
                    pcVar23 = "WARNING";
                  }
                  pcVar20 = "executing tjDecodeYUV()";
                  uVar21 = 0xd3;
                  goto LAB_0010b73f;
                }
                iVar11 = strncmp(tjErrorStr,pcVar13,200);
                if (((iVar11 != 0) ||
                    (iVar11 = bcmp(tjErrorMsg,"executing tjDecodeYUV()",0x18), iVar11 != 0)) ||
                   ((tjErrorCode != 0 || (tjErrorLine != 0xd3)))) {
                  strncpy(tjErrorStr,pcVar13,199);
                  strncpy(tjErrorMsg,"executing tjDecodeYUV()",199);
                  tjErrorCode = 0;
                  tjErrorLine = 0xd3;
                  printf("WARNING in line %d while %s:\n%s\n",0xd3,"executing tjDecodeYUV()",pcVar13
                        );
                }
              }
              if (-1 < local_514) {
                dVar30 = getTime();
                local_4e8 = local_4e8 + (dVar30 - dVar29);
              }
            }
            lVar22 = lVar22 + 1;
            puVar15 = puVar15 + iVar12 * tilew;
            iVar2 = iVar2 - tilew;
          }
          local_4b8 = local_4b8 + tileh * lVar14;
        }
        dVar29 = getTime();
        local_4f8 = local_4f8 + (dVar29 - dVar28);
        if (-1 < local_514) break;
        if (warmup <= local_4f8) {
          local_514 = 0;
          local_4f8 = 0.0;
          local_4e8 = 0.0;
        }
      }
      local_514 = local_514 + 1;
    } while (local_4f8 < benchTime);
    if (doYUV != 0) {
      local_4f8 = local_4f8 - local_4e8;
    }
    iVar8 = tjDestroy(handle);
    iVar7 = extraout_EDX;
    if (iVar8 == -1) {
      iVar7 = tjGetErrorCode(handle);
      pcVar13 = tjGetErrorStr2(handle);
      if ((flags & 0x2000U) != 0 || iVar7 != 0) {
        pcVar23 = "ERROR";
        if (iVar7 == 0) {
          pcVar23 = "WARNING";
        }
        pcVar20 = "executing tjDestroy()";
        uVar21 = 0xe6;
        goto LAB_0010b73f;
      }
      iVar7 = strncmp(tjErrorStr,pcVar13,200);
      if (((iVar7 != 0) || (iVar7 = bcmp(tjErrorMsg,"executing tjDestroy()",0x16), iVar7 != 0)) ||
         ((tjErrorCode != 0 || (iVar7 = extraout_EDX_00, tjErrorLine != 0xe6)))) {
        strncpy(tjErrorStr,pcVar13,199);
        strncpy(tjErrorMsg,"executing tjDestroy()",199);
        tjErrorCode = 0;
        tjErrorLine = 0xe6;
        printf("WARNING in line %d while %s:\n%s\n",0xe6,"executing tjDestroy()",pcVar13);
        iVar7 = extraout_EDX_01;
      }
    }
    dVar28 = (double)local_514;
    if (quiet == 0) {
      pcVar13 = "Decomp to YUV";
      if (doYUV == 0) {
        pcVar13 = "Decompress   ";
      }
      printf("%s --> Frame rate:         %f fps\n",dVar28 / local_4f8,pcVar13);
      dVar29 = ((double)(h * w) / 1000000.0) * dVar28;
      printf("                  Throughput:         %f Megapixels/sec\n",dVar29 / local_4f8);
      if (doYUV != 0) {
        printf("YUV Decode    --> Frame rate:         %f fps\n",dVar28 / local_4e8);
        printf("                  Throughput:         %f Megapixels/sec\n",dVar29 / local_4e8);
      }
    }
    else {
      dVar28 = ((double)(h * w) / 1000000.0) * dVar28;
      sigfig(dVar28 / local_4f8,(int)tempStr,&c_derived_tbl_ehufsi,iVar7);
      pcVar13 = "  ";
      if (quiet == 2) {
        pcVar13 = "\n";
      }
      printf("%-6s%s",tempStr,pcVar13);
      if (doYUV == 0) {
        if (quiet != 2) {
          putchar(10);
        }
      }
      else {
        sigfig(dVar28 / local_4e8,(int)tempStr,&c_derived_tbl_ehufsi,len);
        puts(tempStr);
      }
    }
    if (doWrite == 0) {
      iVar7 = 0;
    }
    else {
      if (sf.denom == 1 && sf.num == 1) {
        if (tileh != h || tilew != w) {
          pcVar13 = "%dx%d";
          goto LAB_0010b985;
        }
        sizeStr._4_4_ = SUB84(sizeStr._0_8_,4) & 0xffffff00;
        builtin_strncpy(sizeStr,"full",4);
      }
      else {
        pcVar13 = "%d_%d";
        tilew = sf.num;
        tileh = sf.denom;
LAB_0010b985:
        snprintf(sizeStr,0x18,pcVar13,(ulong)(uint)tilew,(ulong)(uint)tileh);
      }
      if (decompOnly == 0) {
        snprintf(tempStr,0x400,"%s_%s%s_%s.%s",fileName,subName[subsamp],qualStr,sizeStr,ext);
      }
      else {
        snprintf(tempStr,0x400,"%s_%s.%s",fileName,sizeStr,ext);
      }
      iVar7 = 0;
      iVar5 = tjSaveImage(tempStr,dstBuf,iVar5,0,iVar6,pf,flags);
      if (iVar5 == -1) {
        pcVar13 = tjGetErrorStr2((tjhandle)0x0);
        uVar21 = 0x10e;
LAB_0010bced:
        printf("ERROR in line %d while %s:\n%s\n",uVar21,"saving bitmap",pcVar13);
        iVar7 = -1;
      }
      else {
        pcVar13 = strrchr(tempStr,0x2e);
        snprintf(pcVar13,(size_t)(auStack_38 + -(long)pcVar13),"-err.%s",ext);
        if (((srcBuf != (uchar *)0x0) && (sf.num == 1)) && (sf.denom == 1)) {
          if (quiet == 0) {
            printf("Compression error written to %s.\n");
          }
          uVar17 = 0;
          uVar19 = 0;
          if (0 < h) {
            uVar19 = h;
          }
          if (subsamp == 3) {
            puVar15 = dstBuf;
            iVar5 = 0;
            if (0 < w) {
              iVar5 = w;
            }
            for (; puVar25 = puVar15, puVar26 = srcBuf, iVar6 = iVar5, (uint)uVar17 != uVar19;
                uVar17 = (ulong)((uint)uVar17 + 1)) {
              while (iVar6 != 0) {
                lVar22 = (long)pf;
                iVar7 = tjRedOffset[lVar22];
                iVar8 = tjGreenOffset[lVar22];
                iVar9 = tjBlueOffset[lVar22];
                iVar18 = (int)((double)puVar26[iVar9] * 0.114 +
                               (double)puVar26[iVar7] * 0.299 + (double)puVar26[iVar8] * 0.587 + 0.5
                              );
                if (0xfe < iVar18) {
                  iVar18 = 0xff;
                }
                if (iVar18 < 1) {
                  iVar18 = 0;
                }
                uVar3 = (uchar)((uint)puVar25[iVar7] - iVar18);
                uVar27 = -uVar3;
                if (0 < (int)((uint)puVar25[iVar7] - iVar18)) {
                  uVar27 = uVar3;
                }
                puVar25[iVar7] = uVar27;
                uVar3 = (uchar)((uint)puVar25[iVar8] - iVar18);
                uVar27 = -uVar3;
                if (0 < (int)((uint)puVar25[iVar8] - iVar18)) {
                  uVar27 = uVar3;
                }
                puVar25[iVar8] = uVar27;
                iVar18 = (uint)puVar25[iVar9] - iVar18;
                iVar7 = -iVar18;
                if (0 < iVar18) {
                  iVar7 = iVar18;
                }
                puVar25[iVar9] = (uchar)iVar7;
                puVar25 = puVar25 + iVar12;
                puVar26 = puVar26 + iVar12;
                iVar6 = iVar6 + -1;
              }
              srcBuf = srcBuf + lVar14;
              puVar15 = puVar15 + lVar14;
            }
          }
          else {
            uVar1 = iVar12 * w;
            if (iVar12 * w < 1) {
              uVar1 = 0;
            }
            puVar15 = dstBuf;
            for (; uVar17 != uVar19; uVar17 = uVar17 + 1) {
              for (uVar24 = 0; uVar1 != uVar24; uVar24 = uVar24 + 1) {
                uVar3 = (uchar)((uint)puVar15[uVar24] - (uint)srcBuf[uVar24]);
                uVar27 = -uVar3;
                if (0 < (int)((uint)puVar15[uVar24] - (uint)srcBuf[uVar24])) {
                  uVar27 = uVar3;
                }
                puVar15[uVar24] = uVar27;
              }
              puVar15 = puVar15 + lVar14;
              srcBuf = srcBuf + lVar14;
            }
          }
          iVar7 = 0;
          iVar12 = tjSaveImage(tempStr,dstBuf,w,0,h,pf,flags);
          if (iVar12 == -1) {
            pcVar13 = tjGetErrorStr2((tjhandle)0x0);
            uVar21 = 0x12d;
            goto LAB_0010bced;
          }
        }
      }
    }
  }
  if (bVar4) {
    free(dstBuf);
  }
LAB_0010b76f:
  free(local_510);
  return iVar7;
}

Assistant:

static int decomp(unsigned char *srcBuf, unsigned char **jpegBuf,
                  unsigned long *jpegSize, unsigned char *dstBuf, int w, int h,
                  int subsamp, int jpegQual, char *fileName, int tilew,
                  int tileh)
{
  char tempStr[1024], sizeStr[24] = "\0", qualStr[13] = "\0", *ptr;
  FILE *file = NULL;
  tjhandle handle = NULL;
  int row, col, iter = 0, dstBufAlloc = 0, retval = 0;
  double elapsed, elapsedDecode;
  int ps = tjPixelSize[pf];
  int scaledw = TJSCALED(w, sf);
  int scaledh = TJSCALED(h, sf);
  int pitch = scaledw * ps;
  int ntilesw = (w + tilew - 1) / tilew, ntilesh = (h + tileh - 1) / tileh;
  unsigned char *dstPtr, *dstPtr2, *yuvBuf = NULL;

  if (jpegQual > 0) {
    snprintf(qualStr, 13, "_Q%d", jpegQual);
    qualStr[12] = 0;
  }

  if ((handle = tjInitDecompress()) == NULL)
    THROW_TJ("executing tjInitDecompress()");

  if (dstBuf == NULL) {
    if ((unsigned long long)pitch * (unsigned long long)scaledh >
        (unsigned long long)((size_t)-1))
      THROW("allocating destination buffer", "Image is too large");
    if ((dstBuf = (unsigned char *)malloc((size_t)pitch * scaledh)) == NULL)
      THROW_UNIX("allocating destination buffer");
    dstBufAlloc = 1;
  }
  /* Set the destination buffer to gray so we know whether the decompressor
     attempted to write to it */
  memset(dstBuf, 127, (size_t)pitch * scaledh);

  if (doYUV) {
    int width = doTile ? tilew : scaledw;
    int height = doTile ? tileh : scaledh;
    unsigned long yuvSize = tjBufSizeYUV2(width, yuvPad, height, subsamp);

    if (yuvSize == (unsigned long)-1)
      THROW_TJ("allocating YUV buffer");
    if ((yuvBuf = (unsigned char *)malloc(yuvSize)) == NULL)
      THROW_UNIX("allocating YUV buffer");
    memset(yuvBuf, 127, yuvSize);
  }

  /* Benchmark */
  iter = -1;
  elapsed = elapsedDecode = 0.;
  while (1) {
    int tile = 0;
    double start = getTime();

    for (row = 0, dstPtr = dstBuf; row < ntilesh;
         row++, dstPtr += (size_t)pitch * tileh) {
      for (col = 0, dstPtr2 = dstPtr; col < ntilesw;
           col++, tile++, dstPtr2 += ps * tilew) {
        int width = doTile ? min(tilew, w - col * tilew) : scaledw;
        int height = doTile ? min(tileh, h - row * tileh) : scaledh;

        if (doYUV) {
          double startDecode;

          if (tjDecompressToYUV2(handle, jpegBuf[tile], jpegSize[tile], yuvBuf,
                                 width, yuvPad, height, flags) == -1)
            THROW_TJ("executing tjDecompressToYUV2()");
          startDecode = getTime();
          if (tjDecodeYUV(handle, yuvBuf, yuvPad, subsamp, dstPtr2, width,
                          pitch, height, pf, flags) == -1)
            THROW_TJ("executing tjDecodeYUV()");
          if (iter >= 0) elapsedDecode += getTime() - startDecode;
        } else if (tjDecompress2(handle, jpegBuf[tile], jpegSize[tile],
                                 dstPtr2, width, pitch, height, pf,
                                 flags) == -1)
          THROW_TJ("executing tjDecompress2()");
      }
    }
    elapsed += getTime() - start;
    if (iter >= 0) {
      iter++;
      if (elapsed >= benchTime) break;
    } else if (elapsed >= warmup) {
      iter = 0;
      elapsed = elapsedDecode = 0.;
    }
  }
  if (doYUV) elapsed -= elapsedDecode;

  if (tjDestroy(handle) == -1) THROW_TJ("executing tjDestroy()");
  handle = NULL;

  if (quiet) {
    printf("%-6s%s",
           sigfig((double)(w * h) / 1000000. * (double)iter / elapsed, 4,
                  tempStr, 1024),
           quiet == 2 ? "\n" : "  ");
    if (doYUV)
      printf("%s\n",
             sigfig((double)(w * h) / 1000000. * (double)iter / elapsedDecode,
                    4, tempStr, 1024));
    else if (quiet != 2) printf("\n");
  } else {
    printf("%s --> Frame rate:         %f fps\n",
           doYUV ? "Decomp to YUV" : "Decompress   ", (double)iter / elapsed);
    printf("                  Throughput:         %f Megapixels/sec\n",
           (double)(w * h) / 1000000. * (double)iter / elapsed);
    if (doYUV) {
      printf("YUV Decode    --> Frame rate:         %f fps\n",
             (double)iter / elapsedDecode);
      printf("                  Throughput:         %f Megapixels/sec\n",
             (double)(w * h) / 1000000. * (double)iter / elapsedDecode);
    }
  }

  if (!doWrite) goto bailout;

  if (sf.num != 1 || sf.denom != 1)
    snprintf(sizeStr, 24, "%d_%d", sf.num, sf.denom);
  else if (tilew != w || tileh != h)
    snprintf(sizeStr, 24, "%dx%d", tilew, tileh);
  else snprintf(sizeStr, 24, "full");
  if (decompOnly)
    snprintf(tempStr, 1024, "%s_%s.%s", fileName, sizeStr, ext);
  else
    snprintf(tempStr, 1024, "%s_%s%s_%s.%s", fileName, subName[subsamp],
             qualStr, sizeStr, ext);

  if (tjSaveImage(tempStr, dstBuf, scaledw, 0, scaledh, pf, flags) == -1)
    THROW_TJG("saving bitmap");
  ptr = strrchr(tempStr, '.');
  snprintf(ptr, 1024 - (ptr - tempStr), "-err.%s", ext);
  if (srcBuf && sf.num == 1 && sf.denom == 1) {
    if (!quiet) printf("Compression error written to %s.\n", tempStr);
    if (subsamp == TJ_GRAYSCALE) {
      unsigned long index, index2;

      for (row = 0, index = 0; row < h; row++, index += pitch) {
        for (col = 0, index2 = index; col < w; col++, index2 += ps) {
          unsigned long rindex = index2 + tjRedOffset[pf];
          unsigned long gindex = index2 + tjGreenOffset[pf];
          unsigned long bindex = index2 + tjBlueOffset[pf];
          int y = (int)((double)srcBuf[rindex] * 0.299 +
                        (double)srcBuf[gindex] * 0.587 +
                        (double)srcBuf[bindex] * 0.114 + 0.5);

          if (y > 255) y = 255;
          if (y < 0) y = 0;
          dstBuf[rindex] = abs(dstBuf[rindex] - y);
          dstBuf[gindex] = abs(dstBuf[gindex] - y);
          dstBuf[bindex] = abs(dstBuf[bindex] - y);
        }
      }
    } else {
      for (row = 0; row < h; row++)
        for (col = 0; col < w * ps; col++)
          dstBuf[pitch * row + col] =
            abs(dstBuf[pitch * row + col] - srcBuf[pitch * row + col]);
    }
    if (tjSaveImage(tempStr, dstBuf, w, 0, h, pf, flags) == -1)
      THROW_TJG("saving bitmap");
  }

bailout:
  if (file) fclose(file);
  if (handle) tjDestroy(handle);
  if (dstBufAlloc) free(dstBuf);
  free(yuvBuf);
  return retval;
}